

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

void __thiscall spirv_cross::CompilerGLSL::remap_pls_variables(CompilerGLSL *this)

{
  bool bVar1;
  uint32_t id;
  CompilerError *pCVar2;
  allocator local_c9;
  string local_c8 [32];
  SPIRVariable *local_a8;
  SPIRVariable *var_1;
  PlsRemap *output;
  iterator __end1_1;
  iterator __begin1_1;
  vector<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_> *__range1_1;
  allocator local_69;
  string local_68 [32];
  SPIRType *local_48;
  SPIRType *type;
  SPIRVariable *pSStack_38;
  bool input_is_target;
  SPIRVariable *var;
  PlsRemap *input;
  iterator __end1;
  iterator __begin1;
  vector<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_> *__range1;
  CompilerGLSL *this_local;
  
  __end1 = ::std::vector<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>::begin
                     (&this->pls_inputs);
  input = (PlsRemap *)
          ::std::vector<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>::end
                    (&this->pls_inputs);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<spirv_cross::PlsRemap_*,_std::vector<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>_>
                                *)&input);
    if (!bVar1) {
      __end1_1 = ::std::vector<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>::begin
                           (&this->pls_outputs);
      output = (PlsRemap *)
               ::std::vector<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>::end
                         (&this->pls_outputs);
      while( true ) {
        bVar1 = __gnu_cxx::operator!=
                          (&__end1_1,
                           (__normal_iterator<spirv_cross::PlsRemap_*,_std::vector<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>_>
                            *)&output);
        if (!bVar1) {
          return;
        }
        var_1 = (SPIRVariable *)
                __gnu_cxx::
                __normal_iterator<spirv_cross::PlsRemap_*,_std::vector<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>_>
                ::operator*(&__end1_1);
        local_a8 = Compiler::get<spirv_cross::SPIRVariable>
                             (&this->super_Compiler,
                              *(uint32_t *)&(var_1->super_IVariant)._vptr_IVariant);
        if (local_a8->storage != StorageClassOutput) break;
        local_a8->remapped_variable = true;
        __gnu_cxx::
        __normal_iterator<spirv_cross::PlsRemap_*,_std::vector<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>_>
        ::operator++(&__end1_1);
      }
      pCVar2 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_c8,"Can only use out variables for PLS outputs.",&local_c9);
      CompilerError::CompilerError(pCVar2,(string *)local_c8);
      __cxa_throw(pCVar2,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    var = (SPIRVariable *)
          __gnu_cxx::
          __normal_iterator<spirv_cross::PlsRemap_*,_std::vector<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>_>
          ::operator*(&__end1);
    pSStack_38 = Compiler::get<spirv_cross::SPIRVariable>
                           (&this->super_Compiler,*(uint32_t *)&(var->super_IVariant)._vptr_IVariant
                           );
    type._7_1_ = false;
    if (pSStack_38->storage == StorageClassUniformConstant) {
      id = TypedID::operator_cast_to_unsigned_int
                     ((TypedID *)&(pSStack_38->super_IVariant).field_0xc);
      local_48 = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,id);
      type._7_1_ = (local_48->image).dim == DimSubpassData;
    }
    if ((pSStack_38->storage != StorageClassInput) && ((bool)type._7_1_ == false)) break;
    pSStack_38->remapped_variable = true;
    __gnu_cxx::
    __normal_iterator<spirv_cross::PlsRemap_*,_std::vector<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>_>
    ::operator++(&__end1);
  }
  pCVar2 = (CompilerError *)__cxa_allocate_exception(0x10);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string
            (local_68,"Can only use in and target variables for PLS inputs.",&local_69);
  CompilerError::CompilerError(pCVar2,(string *)local_68);
  __cxa_throw(pCVar2,&CompilerError::typeinfo,CompilerError::~CompilerError);
}

Assistant:

void CompilerGLSL::remap_pls_variables()
{
	for (auto &input : pls_inputs)
	{
		auto &var = get<SPIRVariable>(input.id);

		bool input_is_target = false;
		if (var.storage == StorageClassUniformConstant)
		{
			auto &type = get<SPIRType>(var.basetype);
			input_is_target = type.image.dim == DimSubpassData;
		}

		if (var.storage != StorageClassInput && !input_is_target)
			SPIRV_CROSS_THROW("Can only use in and target variables for PLS inputs.");
		var.remapped_variable = true;
	}

	for (auto &output : pls_outputs)
	{
		auto &var = get<SPIRVariable>(output.id);
		if (var.storage != StorageClassOutput)
			SPIRV_CROSS_THROW("Can only use out variables for PLS outputs.");
		var.remapped_variable = true;
	}
}